

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

string * __thiscall
re2::PrefixSuccessor_abi_cxx11_(string *__return_storage_ptr__,re2 *this,StringPiece *prefix)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_type *local_38;
  ulong local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,*(long *)this,(long)*(int *)(this + 8) + *(long *)this);
  uVar3 = local_30;
  if (0 < (int)local_30) {
    iVar1 = (int)local_30 + 1;
    do {
      uVar3 = (ulong)(iVar1 - 2);
      if (*(char *)((long)local_38 + uVar3) != -1) {
        *(char *)((long)local_38 + uVar3) = *(char *)((long)local_38 + uVar3) + '\x01';
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (local_38 == &local_28) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
        }
        __return_storage_ptr__->_M_string_length = local_30;
        return __return_storage_ptr__;
      }
      if (local_30 < uVar3) {
        uVar2 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        if (local_38 != &local_28) {
          operator_delete(local_38);
        }
        _Unwind_Resume(uVar2);
      }
      *(undefined1 *)((long)local_38 + uVar3) = 0;
      iVar1 = iVar1 + -1;
      local_30 = uVar3;
    } while (1 < iVar1);
  }
  local_30 = uVar3;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string PrefixSuccessor(const StringPiece& prefix) {
  // We can increment the last character in the string and be done
  // unless that character is 255, in which case we have to erase the
  // last character and increment the previous character, unless that
  // is 255, etc. If the string is empty or consists entirely of
  // 255's, we just return the empty string.
  bool done = false;
  string limit(prefix.data(), prefix.size());
  int index = static_cast<int>(limit.size()) - 1;
  while (!done && index >= 0) {
    if ((limit[index]&255) == 255) {
      limit.erase(index);
      index--;
    } else {
      limit[index]++;
      done = true;
    }
  }
  if (!done) {
    return "";
  } else {
    return limit;
  }
}